

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O2

char * google::protobuf::internal::TcParser::FastSmS2
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  ushort uVar1;
  bool bVar2;
  uint uVar3;
  MicroString *str;
  ushort *puVar4;
  ulong uVar5;
  uint *puVar6;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 arena;
  ParseContext *ctx_00;
  char *pcVar7;
  ulong hasbits_00;
  string_view sVar8;
  string_view str_00;
  
  if (data.field_0._0_2_ != 0) {
    pcVar7 = MiniParse(msg,ptr,ctx,data,table,hasbits);
    return pcVar7;
  }
  uVar1 = *(ushort *)ptr;
  str = RefAt<google::protobuf::internal::MicroString>(msg,(ulong)data.field_0 >> 0x30);
  arena = (anon_union_8_1_898a9ca8_for_TcFieldData_0)(msg->_internal_metadata_).ptr_;
  if ((arena.data & 1) != 0) {
    arena = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
            ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)(arena.data & 0xfffffffffffffffe))->data;
  }
  pcVar7 = ptr + 2;
  if (arena.data == 0) {
    arena.data = 0;
  }
  puVar4 = (ushort *)
           EpsCopyInputStream::ReadMicroString
                     (&ctx->super_EpsCopyInputStream,pcVar7,str,(Arena *)arena);
  hasbits_00 = hasbits | 1L << ((ulong)data.field_0 >> 0x10 & 0x3f);
  if (puVar4 != (ushort *)0x0) {
    sVar8 = MicroString::Get(str);
    str_00._M_str = sVar8._M_str;
    str_00._M_len = (size_t)str_00._M_str;
    bVar2 = utf8_range::IsStructurallyValid((utf8_range *)sVar8._M_len,str_00);
    if (!bVar2) {
      ReportFastUtf8Error((int)(char)uVar1 + (uint)uVar1 >> 1,table);
    }
    if (puVar4 < (ctx->super_EpsCopyInputStream).limit_end_) {
      uVar3 = (uint)table->fast_idx_mask & (uint)*puVar4;
      if ((uVar3 & 7) == 0) {
        uVar5 = (ulong)(uVar3 & 0xfffffff8);
        pcVar7 = (char *)(**(code **)(&table[1].has_bits_offset + uVar5))
                                   (msg,puVar4,ctx,
                                    (ulong)*puVar4 ^ *(ulong *)(&table[1].fast_idx_mask + uVar5 * 2)
                                    ,table,hasbits_00);
        return pcVar7;
      }
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x452);
    }
    if ((ulong)table->has_bits_offset != 0) {
      puVar6 = RefAt<unsigned_int>(msg,(ulong)table->has_bits_offset);
      *puVar6 = *puVar6 | (uint)hasbits_00;
    }
    return (char *)puVar4;
  }
  pcVar7 = Error(msg,pcVar7,ctx_00,(TcFieldData)arena,table,hasbits_00);
  return pcVar7;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastSmS2(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return SingularString<uint16_t, MicroString,
                                          kUtf8ValidateOnly>(
      PROTOBUF_TC_PARAM_PASS);
}